

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall QHash<QString,_QString>::begin(QHash<QString,_QString> *this)

{
  iterator iVar1;
  const_iterator cVar2;
  
  if (this->d != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
    iVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::begin(this->d);
    cVar2.i.d = iVar1.d;
    cVar2.i.bucket = iVar1.bucket;
    return (const_iterator)cVar2.i;
  }
  return (piter)ZEXT816(0);
}

Assistant:

inline const_iterator begin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }